

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

_Bool i2p_dsa_verify(uint8_t *pubkey,uint8_t *buf,size_t sz,uint8_t *sig)

{
  int iVar1;
  DSA *pDVar2;
  BIGNUM *pBVar3;
  DSA_SIG *sig_00;
  BIGNUM *pBVar4;
  uchar *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  int ret;
  DSA_SIG *s;
  uint8_t digest [20];
  DSA *pk;
  uchar local_48 [32];
  DSA *local_28;
  uchar *local_20;
  size_t local_18;
  uchar *local_10;
  uchar *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pDVar2 = (DSA *)new_DSA();
  local_28 = pDVar2;
  pBVar3 = BN_bin2bn(local_8,0x80,(BIGNUM *)0x0);
  DSA_set0_key(pDVar2,pBVar3,0);
  SHA1(local_10,local_18,local_48);
  sig_00 = DSA_SIG_new();
  pBVar3 = BN_bin2bn(local_20,10,(BIGNUM *)0x0);
  pBVar4 = BN_bin2bn(local_20 + 10,10,(BIGNUM *)0x0);
  DSA_SIG_set0(sig_00,pBVar3,pBVar4);
  iVar1 = DSA_do_verify(local_48,0x14,sig_00,local_28);
  DSA_SIG_free(sig_00);
  DSA_free(local_28);
  return iVar1 == 1;
}

Assistant:

bool i2p_dsa_verify(const uint8_t * pubkey, const uint8_t * buf, size_t sz, const uint8_t * sig)
{
  DSA * pk = new_DSA();
  DSA_set0_key(pk, BN_bin2bn (pubkey, 128, NULL), NULL);
  uint8_t digest[20];
  SHA1(buf, sz, digest);
  DSA_SIG * s = DSA_SIG_new();
  DSA_SIG_set0 (s, BN_bin2bn (sig, 10, NULL), BN_bin2bn (sig + 10, 10, NULL));
  int ret = DSA_do_verify(digest, 20, s, pk);
  DSA_SIG_free(s);
  DSA_free(pk);
  return ret == 1;
}